

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddLocalCacheResize(DdLocalCache *cache)

{
  uint uVar1;
  DdLocalCacheItem *__ptr;
  _func_void_long *p_Var2;
  uint uVar3;
  int shift_00;
  uint uVar4;
  DdLocalCacheItem *__s;
  long *plVar5;
  long *plVar6;
  DD_OOMFP saveHandler;
  uint oldslots;
  uint slots;
  uint posn;
  int shift;
  int i;
  DdLocalCacheItem *old;
  DdLocalCacheItem *entry;
  DdLocalCacheItem *olditem;
  DdLocalCacheItem *item;
  DdLocalCache *cache_local;
  
  __ptr = cache->item;
  uVar1 = cache->slots;
  uVar3 = uVar1 * 2;
  cache->slots = uVar3;
  p_Var2 = Extra_UtilMMoutOfMemory;
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  __s = (DdLocalCacheItem *)malloc((ulong)(uVar3 * cache->itemsize));
  cache->item = __s;
  Extra_UtilMMoutOfMemory = p_Var2;
  if (__s == (DdLocalCacheItem *)0x0) {
    cache->slots = uVar1;
    cache->item = __ptr;
    cache->maxslots = uVar1 - 1;
  }
  else {
    shift_00 = cache->shift + -1;
    cache->shift = shift_00;
    cache->manager->memused = (ulong)(uVar1 * cache->itemsize) + cache->manager->memused;
    memset(__s,0,(ulong)(uVar3 * cache->itemsize));
    for (posn = 0; posn < uVar1; posn = posn + 1) {
      plVar5 = (long *)((long)__ptr->key + ((ulong)(posn * cache->itemsize) - 8));
      if (*plVar5 != 0) {
        uVar4 = ddLCHash((DdNodePtr *)(plVar5 + 1),cache->keysize,shift_00);
        plVar6 = (long *)((long)__s->key + ((ulong)(uVar4 * cache->itemsize) - 8));
        memcpy(plVar6 + 1,plVar5 + 1,(ulong)cache->keysize << 3);
        *plVar6 = *plVar5;
      }
    }
    if (__ptr != (DdLocalCacheItem *)0x0) {
      free(__ptr);
    }
    cache->lookUps = (double)(int)((double)uVar3 * cache->minHit + 1.0);
    cache->hits = 0.0;
  }
  return;
}

Assistant:

static void
cuddLocalCacheResize(
  DdLocalCache * cache)
{
    DdLocalCacheItem *item, *olditem, *entry, *old;
    int i, shift;
    unsigned int posn;
    unsigned int slots, oldslots;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    olditem = cache->item;
    oldslots = cache->slots;
    slots = cache->slots = oldslots << 1;

#ifdef DD_VERBOSE
    (void) fprintf(cache->manager->err,
                   "Resizing local cache from %d to %d entries\n",
                   oldslots, slots);
    (void) fprintf(cache->manager->err,
                   "\thits = %.0f\tlookups = %.0f\thit ratio = %5.3f\n",
                   cache->hits, cache->lookUps, cache->hits / cache->lookUps);
#endif

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
    cache->item = item =
        (DdLocalCacheItem *) ABC_ALLOC(char, slots * cache->itemsize);
    MMoutOfMemory = saveHandler;
    /* If we fail to allocate the new table we just give up. */
    if (item == NULL) {
#ifdef DD_VERBOSE
        (void) fprintf(cache->manager->err,"Resizing failed. Giving up.\n");
#endif
        cache->slots = oldslots;
        cache->item = olditem;
        /* Do not try to resize again. */
        cache->maxslots = oldslots - 1;
        return;
    }
    shift = --(cache->shift);
    cache->manager->memused += (slots - oldslots) * cache->itemsize;

    /* Clear new cache. */
    memset(item, 0, slots * cache->itemsize);

    /* Copy from old cache to new one. */
    for (i = 0; (unsigned) i < oldslots; i++) {
        old = (DdLocalCacheItem *) ((char *) olditem + i * cache->itemsize);
        if (old->value != NULL) {
            posn = ddLCHash(old->key,cache->keysize,shift);
            entry = (DdLocalCacheItem *) ((char *) item +
                                          posn * cache->itemsize);
            memcpy(entry->key,old->key,cache->keysize*sizeof(DdNode *));
            entry->value = old->value;
        }
    }

    ABC_FREE(olditem);

    /* Reinitialize measurements so as to avoid division by 0 and
    ** immediate resizing.
    */
    cache->lookUps = (double) (int) (slots * cache->minHit + 1);
    cache->hits = 0;

}